

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::FileOptions::Clear(FileOptions *this)

{
  uint uVar1;
  string *psVar2;
  LogMessage *pLVar3;
  LogFinisher local_1a1;
  LogMessage local_1a0;
  LogMessage local_168;
  LogMessage local_130;
  LogMessage local_f8;
  LogMessage local_c0;
  LogMessage local_88;
  LogMessage local_50;
  
  internal::ExtensionSet::Clear(&this->_extensions_);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase);
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x7f) != 0) {
    if ((uVar1 & 1) != 0) {
      if ((this->java_package_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
      {
        internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x20b1);
        pLVar3 = internal::LogMessage::operator<<
                           (&local_50,
                            "CHECK failed: !java_package_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar3);
        internal::LogMessage::~LogMessage(&local_50);
      }
      psVar2 = (this->java_package_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_).has_bits_[0] & 2) != 0) {
      if ((this->java_outer_classname_).ptr_ ==
          (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::LogMessage::LogMessage
                  (&local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x20b5);
        pLVar3 = internal::LogMessage::operator<<
                           (&local_88,
                            "CHECK failed: !java_outer_classname_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=((LogFinisher *)&local_c0,pLVar3);
        internal::LogMessage::~LogMessage(&local_88);
      }
      psVar2 = (this->java_outer_classname_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_).has_bits_[0] & 4) != 0) {
      if ((this->go_package_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::LogMessage::LogMessage
                  (&local_c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x20b9);
        pLVar3 = internal::LogMessage::operator<<
                           (&local_c0,
                            "CHECK failed: !go_package_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=((LogFinisher *)&local_f8,pLVar3);
        internal::LogMessage::~LogMessage(&local_c0);
      }
      psVar2 = (this->go_package_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_).has_bits_[0] & 8) != 0) {
      if ((this->objc_class_prefix_).ptr_ ==
          (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::LogMessage::LogMessage
                  (&local_f8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x20bd);
        pLVar3 = internal::LogMessage::operator<<
                           (&local_f8,
                            "CHECK failed: !objc_class_prefix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=((LogFinisher *)&local_130,pLVar3);
        internal::LogMessage::~LogMessage(&local_f8);
      }
      psVar2 = (this->objc_class_prefix_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_).has_bits_[0] & 0x10) != 0) {
      if ((this->csharp_namespace_).ptr_ ==
          (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::LogMessage::LogMessage
                  (&local_130,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x20c1);
        pLVar3 = internal::LogMessage::operator<<
                           (&local_130,
                            "CHECK failed: !csharp_namespace_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=((LogFinisher *)&local_168,pLVar3);
        internal::LogMessage::~LogMessage(&local_130);
      }
      psVar2 = (this->csharp_namespace_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_).has_bits_[0] & 0x20) != 0) {
      if ((this->swift_prefix_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
      {
        internal::LogMessage::LogMessage
                  (&local_168,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x20c5);
        pLVar3 = internal::LogMessage::operator<<
                           (&local_168,
                            "CHECK failed: !swift_prefix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar3);
        internal::LogMessage::~LogMessage(&local_168);
      }
      psVar2 = (this->swift_prefix_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_).has_bits_[0] & 0x40) != 0) {
      if ((this->php_class_prefix_).ptr_ ==
          (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::LogMessage::LogMessage
                  (&local_1a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x20c9);
        pLVar3 = internal::LogMessage::operator<<
                           (&local_1a0,
                            "CHECK failed: !php_class_prefix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_1a1,pLVar3);
        internal::LogMessage::~LogMessage(&local_1a0);
      }
      psVar2 = (this->php_class_prefix_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
  }
  this->java_multiple_files_ = false;
  if (*(char *)((long)(this->_has_bits_).has_bits_ + 1) != '\0') {
    this->java_generic_services_ = false;
    this->py_generic_services_ = false;
    this->deprecated_ = false;
    this->cc_enable_arenas_ = false;
    this->optimize_for_ = 1;
    this->java_generate_equals_and_hash_ = false;
    this->java_string_check_utf8_ = false;
    this->cc_generic_services_ = false;
    this->java_generic_services_ = false;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void FileOptions::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FileOptions)
  _extensions_.Clear();
  uninterpreted_option_.Clear();
  if (_has_bits_[0 / 32] & 127u) {
    if (has_java_package()) {
      GOOGLE_DCHECK(!java_package_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*java_package_.UnsafeRawStringPointer())->clear();
    }
    if (has_java_outer_classname()) {
      GOOGLE_DCHECK(!java_outer_classname_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*java_outer_classname_.UnsafeRawStringPointer())->clear();
    }
    if (has_go_package()) {
      GOOGLE_DCHECK(!go_package_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*go_package_.UnsafeRawStringPointer())->clear();
    }
    if (has_objc_class_prefix()) {
      GOOGLE_DCHECK(!objc_class_prefix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*objc_class_prefix_.UnsafeRawStringPointer())->clear();
    }
    if (has_csharp_namespace()) {
      GOOGLE_DCHECK(!csharp_namespace_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*csharp_namespace_.UnsafeRawStringPointer())->clear();
    }
    if (has_swift_prefix()) {
      GOOGLE_DCHECK(!swift_prefix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*swift_prefix_.UnsafeRawStringPointer())->clear();
    }
    if (has_php_class_prefix()) {
      GOOGLE_DCHECK(!php_class_prefix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*php_class_prefix_.UnsafeRawStringPointer())->clear();
    }
  }
  java_multiple_files_ = false;
  if (_has_bits_[8 / 32] & 65280u) {
    ::memset(&java_generate_equals_and_hash_, 0, reinterpret_cast<char*>(&cc_enable_arenas_) -
      reinterpret_cast<char*>(&java_generate_equals_and_hash_) + sizeof(cc_enable_arenas_));
    optimize_for_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}